

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Cluster::CreateBlockGroup
          (Cluster *this,longlong start_offset,longlong size,longlong discard_padding)

{
  long lVar1;
  BlockEntry **ppBVar2;
  BlockGroup *this_00;
  BlockGroup *local_100;
  long status;
  BlockGroup *p;
  BlockEntry **pEntry;
  BlockEntry **ppEntry;
  long idx;
  long status_1;
  longlong time;
  long size_;
  longlong size_1;
  longlong id;
  long len;
  longlong bsize;
  longlong bpos;
  longlong duration;
  longlong next;
  longlong prev;
  longlong stop;
  longlong pos;
  IMkvReader *pReader;
  longlong discard_padding_local;
  longlong size_local;
  longlong start_offset_local;
  Cluster *this_local;
  
  pReader = (IMkvReader *)discard_padding;
  discard_padding_local = size;
  size_local = start_offset;
  start_offset_local = (longlong)this;
  if (this->m_entries == (BlockEntry **)0x0) {
    __assert_fail("m_entries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c12,
                  "long mkvparser::Cluster::CreateBlockGroup(long long, long long, long long)");
  }
  if (this->m_entries_size < 1) {
    __assert_fail("m_entries_size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c13,
                  "long mkvparser::Cluster::CreateBlockGroup(long long, long long, long long)");
  }
  if (this->m_entries_count < 0) {
    __assert_fail("m_entries_count >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c14,
                  "long mkvparser::Cluster::CreateBlockGroup(long long, long long, long long)");
  }
  if (this->m_entries_size <= this->m_entries_count) {
    __assert_fail("m_entries_count < m_entries_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c15,
                  "long mkvparser::Cluster::CreateBlockGroup(long long, long long, long long)");
  }
  pos = (longlong)this->m_pSegment->m_pReader;
  prev = start_offset + size;
  next = 1;
  duration = 0;
  bpos = -1;
  bsize = -1;
  len = -1;
  stop = start_offset;
  while (stop < prev) {
    size_1 = ReadID((IMkvReader *)pos,stop,&id);
    if ((size_1 < 0) || (prev < stop + id)) {
      return -2;
    }
    stop = id + stop;
    size_ = ReadUInt((IMkvReader *)pos,stop,&id);
    if (size_ < 0) {
      __assert_fail("size >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1c32,
                    "long mkvparser::Cluster::CreateBlockGroup(long long, long long, long long)");
    }
    if (prev < stop + id) {
      __assert_fail("(pos + len) <= stop",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1c33,
                    "long mkvparser::Cluster::CreateBlockGroup(long long, long long, long long)");
    }
    stop = id + stop;
    if (size_1 == 0xa1) {
      if (bsize < 0) {
        len = size_;
        bsize = stop;
      }
    }
    else if (size_1 == 0x9b) {
      if (8 < size_) {
        return -2;
      }
      bpos = UnserializeUInt((IMkvReader *)pos,stop,size_);
      if (bpos < 0) {
        return -2;
      }
    }
    else if (size_1 == 0xfb) {
      if ((8 < size_) || (size_ < 1)) {
        return -2;
      }
      time = size_;
      lVar1 = UnserializeInt((IMkvReader *)pos,stop,size_,&status_1);
      if (lVar1 != 0) {
        __assert_fail("status == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1c4c,
                      "long mkvparser::Cluster::CreateBlockGroup(long long, long long, long long)");
      }
      if (status_1 < 1) {
        next = status_1;
      }
      else {
        duration = status_1;
      }
    }
    stop = size_ + stop;
    if (prev < stop) {
      return -2;
    }
  }
  if (bsize < 0) {
    return -2;
  }
  if (stop != prev) {
    return -2;
  }
  if (len < 0) {
    __assert_fail("bsize >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c5f,
                  "long mkvparser::Cluster::CreateBlockGroup(long long, long long, long long)");
  }
  lVar1 = this->m_entries_count;
  ppBVar2 = this->m_entries + lVar1;
  this_00 = (BlockGroup *)operator_new(0x68,(nothrow_t *)&std::nothrow);
  local_100 = (BlockGroup *)0x0;
  if (this_00 != (BlockGroup *)0x0) {
    BlockGroup::BlockGroup(this_00,this,lVar1,bsize,len,next,duration,bpos,(longlong)pReader);
    local_100 = this_00;
  }
  *ppBVar2 = &local_100->super_BlockEntry;
  if (*ppBVar2 == (BlockEntry *)0x0) {
    return -1;
  }
  lVar1 = BlockGroup::Parse((BlockGroup *)*ppBVar2);
  if (lVar1 == 0) {
    this->m_entries_count = this->m_entries_count + 1;
    return 0;
  }
  if (*ppBVar2 != (BlockEntry *)0x0) {
    (*(*ppBVar2)->_vptr_BlockEntry[1])();
  }
  *ppBVar2 = (BlockEntry *)0x0;
  return lVar1;
}

Assistant:

long Cluster::CreateBlockGroup(long long start_offset, long long size,
                               long long discard_padding) {
  assert(m_entries);
  assert(m_entries_size > 0);
  assert(m_entries_count >= 0);
  assert(m_entries_count < m_entries_size);

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = start_offset;
  const long long stop = start_offset + size;

  // For WebM files, there is a bias towards previous reference times
  //(in order to support alt-ref frames, which refer back to the previous
  // keyframe).  Normally a 0 value is not possible, but here we tenatively
  // allow 0 as the value of a reference frame, with the interpretation
  // that this is a "previous" reference time.

  long long prev = 1;  // nonce
  long long next = 0;  // nonce
  long long duration = -1;  // really, this is unsigned

  long long bpos = -1;
  long long bsize = -1;

  while (pos < stop) {
    long len;
    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    assert(size >= 0);  // TODO
    assert((pos + len) <= stop);

    pos += len;  // consume size

    if (id == libwebm::kMkvBlock) {
      if (bpos < 0) {  // Block ID
        bpos = pos;
        bsize = size;
      }
    } else if (id == libwebm::kMkvBlockDuration) {
      if (size > 8)
        return E_FILE_FORMAT_INVALID;

      duration = UnserializeUInt(pReader, pos, size);

      if (duration < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvReferenceBlock) {
      if (size > 8 || size <= 0)
        return E_FILE_FORMAT_INVALID;
      const long size_ = static_cast<long>(size);

      long long time;

      long status = UnserializeInt(pReader, pos, size_, time);
      assert(status == 0);
      if (status != 0)
        return -1;

      if (time <= 0)  // see note above
        prev = time;
      else
        next = time;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }
  if (bpos < 0)
    return E_FILE_FORMAT_INVALID;

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  assert(bsize >= 0);

  const long idx = m_entries_count;

  BlockEntry** const ppEntry = m_entries + idx;
  BlockEntry*& pEntry = *ppEntry;

  pEntry = new (std::nothrow)
      BlockGroup(this, idx, bpos, bsize, prev, next, duration, discard_padding);

  if (pEntry == NULL)
    return -1;  // generic error

  BlockGroup* const p = static_cast<BlockGroup*>(pEntry);

  const long status = p->Parse();

  if (status == 0) {  // success
    ++m_entries_count;
    return 0;
  }

  delete pEntry;
  pEntry = 0;

  return status;
}